

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::standard_reporter::print_statistic_estimate
          (standard_reporter *this,char *name,
          estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> estimate)

{
  _Setprecision _Var1;
  ostream *poVar2;
  char *in_RSI;
  long in_RDI;
  double in_stack_00000020;
  fp_seconds in_stack_000000d8;
  undefined8 in_stack_fffffffffffffef8;
  fmtflags __mask;
  ios_base *in_stack_ffffffffffffff00;
  string local_98 [40];
  string local_70 [56];
  string local_38 [36];
  int local_14;
  char *local_10;
  
  __mask = (fmtflags)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_10 = in_RSI;
  poVar2 = reporter::report_stream((reporter *)0x1ed406);
  local_14 = (int)std::setprecision(7);
  std::operator<<(poVar2,(_Setprecision)local_14);
  reporter::report_stream((reporter *)0x1ed437);
  std::ios_base::unsetf(in_stack_ffffffffffffff00,__mask);
  poVar2 = reporter::report_stream((reporter *)0x1ed458);
  poVar2 = std::operator<<(poVar2,local_10);
  poVar2 = std::operator<<(poVar2,": ");
  nonius::detail::pretty_duration_abi_cxx11_(in_stack_000000d8);
  std::operator<<(poVar2,local_38);
  std::__cxx11::string::~string(local_38);
  if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
    poVar2 = reporter::report_stream((reporter *)0x1ed4e1);
    poVar2 = std::operator<<(poVar2,", lb ");
    nonius::detail::pretty_duration_abi_cxx11_(in_stack_000000d8);
    poVar2 = std::operator<<(poVar2,local_70);
    poVar2 = std::operator<<(poVar2,", ub ");
    nonius::detail::pretty_duration_abi_cxx11_(in_stack_000000d8);
    poVar2 = std::operator<<(poVar2,local_98);
    poVar2 = std::operator<<(poVar2,", ci ");
    _Var1 = std::setprecision(3);
    poVar2 = std::operator<<(poVar2,_Var1);
    std::ostream::operator<<(poVar2,in_stack_00000020);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_70);
  }
  poVar2 = reporter::report_stream((reporter *)0x1ed660);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void print_statistic_estimate(const char* name, estimate<fp_seconds> estimate) {
            report_stream() << std::setprecision(7);
            report_stream().unsetf(std::ios::floatfield);
            report_stream() << name << ": " << detail::pretty_duration(estimate.point);
            if(!summary) {
                report_stream() << ", lb " << detail::pretty_duration(estimate.lower_bound)
                         << ", ub " << detail::pretty_duration(estimate.upper_bound)
                         << ", ci " << std::setprecision(3) << estimate.confidence_interval;
            }
            report_stream() << "\n";
        }